

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

HighsStatus __thiscall HEkkDual::solve(HEkkDual *this,bool pass_force_phase2)

{
  int iVar1;
  bool bVar2;
  HighsStatus HVar3;
  HighsDebugStatus HVar4;
  HighsStatus HVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  byte in_SIL;
  HEkk *in_RDI;
  HighsStatus call_status;
  HEkkPrimal primal_solver;
  double save_primal_simplex_bound_perturbation_multiplier;
  HighsStatus return_status;
  HighsInt it0;
  bool perturb_costs;
  bool near_optimal;
  bool no_simplex_dual_infeasibilities;
  SimplexBasis *basis;
  bool dual_feasible_with_unperturbed_costs;
  HighsModelStatus *model_status;
  HighsSimplexStatus *status;
  HighsSimplexInfo *info;
  HighsOptions *options;
  undefined1 in_stack_00002427;
  HEkkPrimal *in_stack_00002428;
  HighsLogOptions *in_stack_fffffffffffff7e8;
  HighsStatus in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f4;
  HighsStatus HVar8;
  HighsInt in_stack_fffffffffffff7f8;
  HighsInt in_stack_fffffffffffff7fc;
  HEkkDual *in_stack_fffffffffffff800;
  allocator *paVar9;
  size_type in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff814;
  HEkkDual *in_stack_fffffffffffff818;
  bool local_7d2;
  undefined1 in_stack_fffffffffffff82f;
  HEkk *in_stack_fffffffffffff830;
  HighsStatus in_stack_fffffffffffff838;
  HighsStatus in_stack_fffffffffffff83c;
  undefined4 in_stack_fffffffffffff840;
  undefined4 uVar10;
  HEkk *this_00;
  allocator local_7a1;
  string local_7a0 [8];
  HEkk *in_stack_fffffffffffff868;
  HEkkPrimal *in_stack_fffffffffffff870;
  HEkkDual *in_stack_fffffffffffff890;
  undefined1 in_stack_fffffffffffff8b7;
  HighsInt in_stack_fffffffffffff8b8;
  SimplexAlgorithm in_stack_fffffffffffff8bc;
  undefined7 in_stack_fffffffffffff8c0;
  undefined1 in_stack_fffffffffffff8c7;
  HighsInt in_stack_fffffffffffff8c8;
  SimplexAlgorithm in_stack_fffffffffffff8cc;
  HEkk *in_stack_fffffffffffff8d0;
  HEkk *in_stack_fffffffffffff9d0;
  allocator local_a9;
  string local_a8 [37];
  byte local_83;
  bool local_82;
  byte local_81;
  double *local_80;
  byte local_71;
  HighsTimer *local_70;
  pointer *local_68;
  vector<double,_std::allocator<double>_> *local_60;
  double local_58;
  undefined1 local_39 [40];
  byte local_11;
  HighsStatus local_4;
  
  local_11 = in_SIL & 1;
  initialiseSolve((HEkkDual *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
  this_00 = (HEkk *)local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_39 + 1),"Initialise",(allocator *)this_00);
  HVar3 = debugDualSimplex((HEkkDual *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838)
                           ,(string *)in_stack_fffffffffffff830,(bool)in_stack_fffffffffffff82f);
  std::__cxx11::string::~string((string *)(local_39 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_39);
  if (HVar3 == 6) {
    local_4 = HEkk::returnFromSolve(in_RDI,6);
  }
  else {
    bVar2 = HEkk::isUnconstrainedLp
                      ((HEkk *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
    if (bVar2) {
      local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
    }
    else {
      local_58 = in_RDI->timer_->initial_clock_start;
      local_60 = &in_RDI->timer_[0x46].clock_start;
      local_68 = &in_RDI->timer_[0x46].clock_num_call.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_70 = in_RDI->timer_ + 0x4e;
      bVar2 = dualInfoOk(in_stack_fffffffffffff818,
                         (HighsLp *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
      if (bVar2) {
        possiblyUseLiDualSteepestEdge(in_stack_fffffffffffff800);
        if (((ulong)local_68[1] & 1) == 0) {
          highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kError,
                      "HDual:: Should enter solve with INVERT\n");
          local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
        }
        else {
          HEkk::initialiseCost
                    ((HEkk *)CONCAT17(in_stack_fffffffffffff8c7,in_stack_fffffffffffff8c0),
                     in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8,
                     (bool)in_stack_fffffffffffff8b7);
          HEkk::computeDual(in_stack_fffffffffffff9d0);
          HEkk::computeSimplexDualInfeasible(in_stack_fffffffffffff830);
          local_71 = *(int *)(local_60 + 0x26) == 0;
          uVar10 = CONCAT13(1,(int3)in_stack_fffffffffffff840);
          if ((local_11 & 1) == 0) {
            uVar10 = CONCAT13(*(double *)((long)(local_60 + 0x26) + 8) *
                              *(double *)((long)(local_60 + 0x26) + 8) <
                              *(double *)((long)in_RDI->timer_->initial_clock_start + 0x120),
                              (int3)in_stack_fffffffffffff840);
          }
          (in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor._M_pod_data
          [8] = (char)((uint)uVar10 >> 0x18);
          if ((((ulong)in_RDI->timer_[0x6a].clock_num_call.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_finish & 0x1000000) != 0) && (!(bool)local_71)) {
            local_80 = &in_RDI->timer_[0x4e].initial_clock_start;
            highsLogDev(*(HighsLogOptions **)((long)(local_60 + 0x26) + 8),
                        *(HighsLogType *)((long)(local_60 + 0x26) + 0x10),
                        (char *)((long)local_58 + 0x380),4,
                        "Basis should be dual feasible, but duals without cost perturbation have num / max / sum = %4d / %g / %g infeasibilities"
                        ,(ulong)*(uint *)(local_60 + 0x26));
            if (((in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor.
                 _M_pod_data[8] & 1U) == 0) {
              in_stack_fffffffffffff830 = (HEkk *)((long)local_58 + 0x380);
              in_stack_fffffffffffff838 = *(HighsStatus *)(local_80 + 10);
              in_stack_fffffffffffff83c = *(HighsStatus *)((long)local_80 + 0x54);
              uVar6 = std::__cxx11::string::c_str();
              highsLogDev((HighsLogOptions *)in_stack_fffffffffffff830,kWarning,
                          " !!Not forcing phase 2!! basis Id = %d; update count = %d; name = %s\n",
                          (ulong)(uint)in_stack_fffffffffffff838,
                          (ulong)(uint)in_stack_fffffffffffff83c,uVar6);
            }
            else {
              highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kWarning,"\n");
            }
          }
          local_81 = 1;
          if ((local_71 & 1) == 0) {
            local_81 = (in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor
                       ._M_pod_data[8];
          }
          local_81 = local_81 & 1;
          local_7d2 = false;
          if ((local_81 != 0) && (local_7d2 = false, *(int *)(local_60 + 0x25) < 1000)) {
            local_7d2 = *(double *)((long)(local_60 + 0x25) + 8) <= 0.001 &&
                        *(double *)((long)(local_60 + 0x25) + 8) != 0.001;
          }
          local_82 = local_7d2;
          if (local_7d2 != false) {
            highsLogDev(*(HighsLogOptions **)((long)(local_60 + 0x25) + 8),
                        *(HighsLogType *)((long)(local_60 + 0x25) + 0x10),
                        (char *)((long)local_58 + 0x380),2,
                        "Dual feasible with unperturbed costs and num / max / sum primal infeasibilities of %d / %g / %g, so near-optimal\n"
                        ,(ulong)*(uint *)(local_60 + 0x25));
          }
          local_83 = (local_82 ^ 0xffU) & 1;
          if (local_83 == 0) {
            highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kDetailed,
                        "Near-optimal, so don\'t use cost perturbation\n");
          }
          HEkk::initialiseCost
                    ((HEkk *)CONCAT17(in_stack_fffffffffffff8c7,in_stack_fffffffffffff8c0),
                     in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8,
                     (bool)in_stack_fffffffffffff8b7);
          bVar2 = HEkk::bailout(this_00);
          if (bVar2) {
            local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
          }
          else {
            if (((ulong)*local_68 & 0x100000000000000) == 0) {
              std::vector<double,_std::allocator<double>_>::assign
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         (size_type)in_stack_fffffffffffff7e8,(value_type_conflict1 *)0x78494d);
              std::vector<double,_std::allocator<double>_>::resize
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                         in_stack_fffffffffffff808);
              if (*(int *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) == 2) {
                bVar2 = HEkk::logicalBasis((HEkk *)CONCAT44(in_stack_fffffffffffff7fc,
                                                            in_stack_fffffffffffff7f8));
                if (bVar2) {
                  *(undefined1 *)((long)local_68 + 7) = 1;
                }
                else if ((local_82 & 1U) == 0) {
                  highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kDetailed,
                              "Basis is not logical, so compute steepest edge weights\n");
                  HEkk::computeDualSteepestEdgeWeights
                            (in_stack_fffffffffffff8d0,SUB41(in_stack_fffffffffffff8cc >> 0x18,0));
                  *(undefined1 *)((long)local_68 + 7) = 1;
                }
                else {
                  highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kDetailed,
                              "Basis is not logical, but near-optimal, so use Devex rather than compute steepest edge weights\n"
                             );
                  *(undefined4 *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) = 1;
                }
              }
              if (*(int *)((long)&(in_RDI->analysis_).log_options.log_stream + 4) == 1) {
                initialiseDevexFramework
                          ((HEkkDual *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810)
                          );
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_a8,"before solve",&local_a9);
              HEkk::devDebugDualSteepestEdgeWeights
                        ((HEkk *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         (string *)in_stack_fffffffffffff7e8);
              std::__cxx11::string::~string(local_a8);
              std::allocator<char>::~allocator((allocator<char> *)&local_a9);
            }
            std::vector<double,_std::allocator<double>_>::resize
                      ((vector<double,_std::allocator<double>_> *)
                       CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                       in_stack_fffffffffffff808);
            if ((local_83 & 1) != 0) {
              HEkk::computeDual(in_stack_fffffffffffff9d0);
              computeDualInfeasibilitiesWithFixedVariableFlips((HEkkDual *)CONCAT44(HVar3,uVar10));
              *(undefined4 *)
               &(in_RDI->analysis_).cleanup_primal_step_distribution.limit_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage = *(undefined4 *)(local_60 + 0x26);
            }
            if (((in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor.
                 _M_pod_data[8] & 1U) == 0) {
              uVar7 = 2;
              if (0 < *(int *)&(in_RDI->analysis_).cleanup_primal_step_distribution.limit_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage) {
                uVar7 = 1;
              }
              *(undefined4 *)
               ((long)&(in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor
               + 0xc) = uVar7;
            }
            else {
              *(undefined4 *)
               ((long)&(in_RDI->analysis_).log_options.user_callback.super__Function_base._M_functor
               + 0xc) = 2;
            }
            HVar4 = HEkk::debugOkForSolve
                              ((HEkk *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838)
                               ,(SimplexAlgorithm)((ulong)in_stack_fffffffffffff830 >> 0x20),
                               (HighsInt)in_stack_fffffffffffff830);
            if (HVar4 == kLogicalError) {
              local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
            }
            else {
              while (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                     super__Function_base._M_functor + 0xc) != 0) {
                iVar1 = *(int *)&in_RDI->timer_[0x67].clock_start.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
                *(undefined1 *)((long)local_68 + 0xb) = 0;
                if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == -1) {
                  HEkk::initialiseBound
                            (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                             in_stack_fffffffffffff8c8,(bool)in_stack_fffffffffffff8c7);
                  HEkk::initialiseNonbasicValueAndMove(in_stack_fffffffffffff830);
                  computeDualInfeasibilitiesWithFixedVariableFlips
                            ((HEkkDual *)CONCAT44(HVar3,uVar10));
                  *(undefined4 *)
                   &(in_RDI->analysis_).cleanup_primal_step_distribution.limit_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(local_60 + 0x26);
                  uVar7 = 2;
                  if (0 < *(int *)&(in_RDI->analysis_).cleanup_primal_step_distribution.limit_.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage) {
                    uVar7 = 1;
                  }
                  *(undefined4 *)
                   ((long)&(in_RDI->analysis_).log_options.user_callback.super__Function_base.
                           _M_functor + 0xc) = uVar7;
                  if ((*(byte *)((long)(local_60 + 0x12) + 8) & 1) != 0) {
                    HEkk::initialiseBound
                              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8cc,
                               in_stack_fffffffffffff8c8,(bool)in_stack_fffffffffffff8c7);
                    HEkk::initialiseNonbasicValueAndMove(in_stack_fffffffffffff830);
                    *(undefined1 *)((long)(local_60 + 0x12) + 8) = 0;
                  }
                }
                if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == 1) {
                  HighsSimplexAnalysis::simplexTimerStart
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  solvePhase1(in_stack_fffffffffffff890);
                  HighsSimplexAnalysis::simplexTimerStop
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  *(int *)(local_60 + 0x27) =
                       (*(int *)&in_RDI->timer_[0x67].clock_start.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - iVar1) +
                       *(int *)(local_60 + 0x27);
                }
                else {
                  if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                      super__Function_base._M_functor + 0xc) != 2) {
                    *(undefined4 *)&local_70->_vptr_HighsTimer = 4;
                    HVar3 = HEkk::returnFromSolve(in_RDI,HVar3);
                    return HVar3;
                  }
                  HighsSimplexAnalysis::simplexTimerStart
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  solvePhase2(in_stack_fffffffffffff890);
                  HighsSimplexAnalysis::simplexTimerStop
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  *(int *)((long)(local_60 + 0x27) + 4) =
                       (*(int *)&in_RDI->timer_[0x67].clock_start.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - iVar1) +
                       *(int *)((long)(local_60 + 0x27) + 4);
                }
                if (((ulong)in_RDI->timer_[0x67].clock_time.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish & 1) != 0) {
                  HVar3 = HEkk::returnFromSolve(in_RDI,HVar3);
                  return HVar3;
                }
                if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == 5) {
                  *(undefined4 *)&in_RDI->timer_[0x4e]._vptr_HighsTimer = 0xf;
                  HVar3 = HEkk::returnFromSolve(in_RDI,HVar3);
                  return HVar3;
                }
                if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == -3) {
                  HVar3 = HEkk::returnFromSolve(in_RDI,HVar3);
                  return HVar3;
                }
                if (((*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                      super__Function_base._M_functor + 0xc) == -2) ||
                    (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                     super__Function_base._M_functor + 0xc) == 4)) ||
                   (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == 3)) break;
              }
              if ((*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                   super__Function_base._M_functor + 0xc) == 4) ||
                 (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.super__Function_base
                                  ._M_functor + 0xc) == 3)) {
                *(int *)((long)&in_RDI->timer_[0x67].clock_start.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4) =
                     *(int *)((long)&in_RDI->timer_[0x67].clock_start.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage + 4) + 1;
                if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                    super__Function_base._M_functor + 0xc) == 3) {
                  HEkk::computeSimplexInfeasible
                            ((HEkk *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
                }
                if (*(int *)((long)local_58 + 0x230) <
                    *(int *)((long)&in_RDI->timer_[0x67].clock_start.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 4)) {
                  highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kWarning,
                              "HEkkDual:: Cannot use level %d primal simplex cleanup for %d dual infeasibilities\n"
                              ,(ulong)*(uint *)((long)&in_RDI->timer_[0x67].clock_start.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                               + 4),(ulong)*(uint *)(local_60 + 0x26));
                  if (*(int *)((long)&(in_RDI->analysis_).log_options.user_callback.
                                      super__Function_base._M_functor + 0xc) == 4) {
                    *(undefined4 *)&in_RDI->timer_[0x4e]._vptr_HighsTimer = 7;
                  }
                  else {
                    *(undefined4 *)&in_RDI->timer_[0x4e]._vptr_HighsTimer = 8;
                  }
                }
                else {
                  highsLogDev(*(HighsLogOptions **)((long)(local_60 + 0x26) + 8),
                              *(HighsLogType *)((long)(local_60 + 0x26) + 0x10),
                              (char *)((long)local_58 + 0x380),1,
                              "HEkkDual:: Using primal simplex to try to clean up num / max / sum = %d / %g / %g dual infeasibilities\n"
                              ,(ulong)*(uint *)(local_60 + 0x26));
                  HighsSimplexAnalysis::simplexTimerStart
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  uVar6 = *(undefined8 *)((long)(local_60 + 0x1d) + 0x10);
                  *(undefined8 *)((long)(local_60 + 0x1d) + 0x10) = 0;
                  HEkkPrimal::HEkkPrimal(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
                  HEkkPrimal::solve(in_stack_00002428,(bool)in_stack_00002427);
                  *(undefined8 *)((long)(local_60 + 0x1d) + 0x10) = uVar6;
                  HighsSimplexAnalysis::simplexTimerStop
                            ((HighsSimplexAnalysis *)in_stack_fffffffffffff800,
                             in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8);
                  HighsLogOptions::HighsLogOptions
                            ((HighsLogOptions *)
                             CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                             in_stack_fffffffffffff7e8);
                  paVar9 = &local_7a1;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_7a0,"HEkkPrimal::solve",paVar9);
                  HVar5 = interpretCallStatus((HighsLogOptions *)CONCAT44(HVar3,uVar10),
                                              in_stack_fffffffffffff83c,in_stack_fffffffffffff838,
                                              (string *)in_stack_fffffffffffff830);
                  HVar8 = HVar5;
                  std::__cxx11::string::~string(local_7a0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
                  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x785079);
                  *(undefined1 *)
                   ((long)&in_RDI->timer_[0x67].clock_time.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1) = 0;
                  if (HVar5 == kOk) {
                    if ((*(int *)&in_RDI->timer_[0x4e]._vptr_HighsTimer == 7) &&
                       (*(int *)(local_60 + 0x25) + *(int *)(local_60 + 0x26) != 0)) {
                      highsLogDev(*(HighsLogOptions **)((long)(local_60 + 0x25) + 8),
                                  *(HighsLogType *)((long)(local_60 + 0x26) + 8),
                                  (char *)((long)local_58 + 0x380),4,
                                  "HEkkDual:: Primal simplex clean up yields optimality, but with %d (max %g) primal infeasibilities and d (max %g) dual infeasibilities\n"
                                  ,(ulong)*(uint *)(local_60 + 0x25),
                                  (ulong)*(uint *)(local_60 + 0x26));
                    }
                    bVar2 = false;
                  }
                  else {
                    in_stack_fffffffffffff7f0 = HEkk::returnFromSolve(in_RDI,HVar3);
                    bVar2 = true;
                    local_4 = in_stack_fffffffffffff7f0;
                  }
                  HEkkPrimal::~HEkkPrimal((HEkkPrimal *)CONCAT44(HVar8,in_stack_fffffffffffff7f0));
                  if (bVar2) {
                    return local_4;
                  }
                }
              }
              HVar4 = HEkk::debugOkForSolve
                                ((HEkk *)CONCAT44(in_stack_fffffffffffff83c,
                                                  in_stack_fffffffffffff838),
                                 (SimplexAlgorithm)((ulong)in_stack_fffffffffffff830 >> 0x20),
                                 (HighsInt)in_stack_fffffffffffff830);
              if (HVar4 == kLogicalError) {
                local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
              }
              else {
                local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
              }
            }
          }
        }
      }
      else {
        highsLogDev((HighsLogOptions *)((long)local_58 + 0x380),kError,
                    "HPrimalDual::solve has error in dual information\n");
        local_4 = HEkk::returnFromSolve(in_RDI,HVar3);
      }
    }
  }
  return local_4;
}

Assistant:

HighsStatus HEkkDual::solve(const bool pass_force_phase2) {
  // Initialise control data for a particular solve
  initialiseSolve();

  if (debugDualSimplex("Initialise", true) == HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  // Assumes that the LP has a positive number of rows
  if (ekk_instance_.isUnconstrainedLp())
    return ekk_instance_.returnFromSolve(HighsStatus::kError);

  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexInfo& info = ekk_instance_.info_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;

  if (!dualInfoOk(ekk_instance_.lp_)) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HPrimalDual::solve has error in dual information\n");
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  // Possibly use Li dual steepest edge weights by not storing squared
  // primal infeasibilities
  possiblyUseLiDualSteepestEdge();

  assert(status.has_invert);
  if (!status.has_invert) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "HDual:: Should enter solve with INVERT\n");
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  }

  // Determine the duals without cost perturbation
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown);
  ekk_instance_.computeDual();
  ekk_instance_.computeSimplexDualInfeasible();
  // Record whether the solution with unperturbed costs is dual feasible
  const bool dual_feasible_with_unperturbed_costs =
      info.num_dual_infeasibilities == 0;
  // Force phase 2 if dual infeasibilities without cost perturbation
  // involved fixed variables or were (at most) small
  force_phase2 = pass_force_phase2 ||
                 info.max_dual_infeasibility * info.max_dual_infeasibility <
                     ekk_instance_.options_->dual_feasibility_tolerance;
  // Within the MIP solver, unless the basis supplied was alien, the
  // simplex solver should be able to start from dual feasibility, so
  // possibly debug this property. Note that debug_dual_feasible is
  // set in HEkk::setBasis, and is false if kDebugMipNodeDualFeasible
  // is false
  if (ekk_instance_.debug_dual_feasible &&
      !dual_feasible_with_unperturbed_costs) {
    SimplexBasis& basis = ekk_instance_.basis_;
    highsLogDev(
        options.log_options, HighsLogType::kWarning,
        "Basis should be dual feasible, but duals without cost perturbation "
        "have num / max / sum = %4d / %g / %g infeasibilities",
        (int)info.num_dual_infeasibilities, info.max_dual_infeasibility,
        info.sum_dual_infeasibilities);
    if (!force_phase2) {
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  " !!Not forcing phase 2!! basis Id = %d; update count = %d; "
                  "name = %s\n",
                  (int)basis.debug_id, (int)basis.debug_update_count,
                  basis.debug_origin_name.c_str());
    } else {
      highsLogDev(options.log_options, HighsLogType::kWarning, "\n");
    }
  }
  // Determine whether the solution is near-optimal. Values 1000 and
  // 1e-3 (ensuring sum<1) are unimportant, as the sum of primal
  // infeasibilities for near-optimal solutions is typically many
  // orders of magnitude smaller than 1, and the sum of primal
  // infeasibilities will be very much larger for non-trivial LPs
  // that are dual feasible for a logical or crash basis.
  //
  // Consider there to be no dual infeasibilities if there are none,
  // or if phase 2 is forced, in which case any dual infeasibilities
  // will be shifted
  const bool no_simplex_dual_infeasibilities =
      dual_feasible_with_unperturbed_costs || force_phase2;
  const bool near_optimal = no_simplex_dual_infeasibilities &&
                            info.num_primal_infeasibilities < 1000 &&
                            info.max_primal_infeasibility < 1e-3;
  if (near_optimal)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Dual feasible with unperturbed costs and num / max / sum "
                "primal infeasibilities of "
                "%" HIGHSINT_FORMAT
                " / %g "
                "/ %g, so near-optimal\n",
                info.num_primal_infeasibilities, info.max_primal_infeasibility,
                info.sum_primal_infeasibilities);

  // Perturb costs according to whether the solution is near-optimal
  const bool perturb_costs = !near_optimal;
  if (!perturb_costs)
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "Near-optimal, so don't use cost perturbation\n");
  ekk_instance_.initialiseCost(SimplexAlgorithm::kDual, kSolvePhaseUnknown,
                               perturb_costs);
  // Check whether the time/iteration limit has been reached. First
  // point at which a non-error return can occur
  if (ekk_instance_.bailout())
    return ekk_instance_.returnFromSolve(HighsStatus::kWarning);

  // Consider initialising edge weights
  if (status.has_dual_steepest_edge_weights) {
    // Dual steepest edge weights are known, so possibly check
    assert((HighsInt)ekk_instance_.dual_edge_weight_.size() >= solver_num_row);
    assert((HighsInt)ekk_instance_.scattered_dual_edge_weight_.size() >=
           solver_num_tot);
    ekk_instance_.devDebugDualSteepestEdgeWeights("before solve");
  } else {
    // Set up edge weights
    //
    // Assign unit weights - necessary for Dantzig and Devex, and
    // correct for steepest edge when B=I so, for clarity, do it for
    // all. Also ensure that the scattering vector is the right size
    ekk_instance_.dual_edge_weight_.assign(solver_num_row, 1.0);
    ekk_instance_.scattered_dual_edge_weight_.resize(solver_num_tot);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      // Intending to using dual steepest edge weights
      //
      // Exact DSE weights need to be computed if the basis contains
      // structurals
      if (ekk_instance_.logicalBasis()) {
        // Unit weights already set up for B=I
        status.has_dual_steepest_edge_weights = true;
      } else {
        // Non-logical basis
        if (near_optimal) {
          // Use Devex rather than compute steepest edge weights
          highsLogDev(
              options.log_options, HighsLogType::kDetailed,
              "Basis is not logical, but near-optimal, so use Devex rather "
              "than compute steepest edge weights\n");
          edge_weight_mode = EdgeWeightMode::kDevex;
          assert(!status.has_dual_steepest_edge_weights);
        } else {
          // Compute steepest edge weights
          highsLogDev(
              options.log_options, HighsLogType::kDetailed,
              "Basis is not logical, so compute steepest edge weights\n");
          ekk_instance_.computeDualSteepestEdgeWeights(true);
          status.has_dual_steepest_edge_weights = true;
        }
      }
    }
    if (edge_weight_mode == EdgeWeightMode::kDevex) initialiseDevexFramework();
    // Check on consistency between edge_weight_mode and
    // status.has_dual_steepest_edge_weights
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      assert(status.has_dual_steepest_edge_weights);
    } else {
      assert(!status.has_dual_steepest_edge_weights);
    }
  }
  // Resize the copy of scattered edge weights for backtracking
  info.backtracking_basis_edge_weight_.resize(solver_num_tot);

  if (perturb_costs) {
    // Compute the dual values with perturbed costs
    ekk_instance_.computeDual();
    // Determine the number of dual infeasibilities after fixed
    // variable flips
    computeDualInfeasibilitiesWithFixedVariableFlips();
    dualInfeasCount = info.num_dual_infeasibilities;
  }

  // Determine the solve phase
  if (force_phase2) {
    // Dual infeasibilities without cost perturbation involved
    // fixed variables or were (at most) small, so can easily be
    // removed by flips for fixed variables and shifts for the rest
    solve_phase = kSolvePhase2;
  } else {
    // Phase depends on the number of dual infeasibilities after fixed
    // variable flips
    solve_phase = dualInfeasCount > 0 ? kSolvePhase1 : kSolvePhase2;
  }
  if (ekk_instance_.debugOkForSolve(SimplexAlgorithm::kDual, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  //
  // The major solving loop
  //
  while (solve_phase) {
    HighsInt it0 = ekk_instance_.iteration_count_;
    // When starting a new phase the (updated) dual objective function
    // value isn't known. Indicate this so that when the value
    // computed from scratch in rebuild() isn't checked against the
    // the updated value
    status.has_dual_objective_value = false;
    if (solve_phase == kSolvePhaseUnknown) {
      // Reset the phase 2 bounds so that true number of dual
      // infeasibilities can be determined
      ekk_instance_.initialiseBound(SimplexAlgorithm::kDual,
                                    kSolvePhaseUnknown);
      ekk_instance_.initialiseNonbasicValueAndMove();
      // Determine the number of unavoidable dual infeasibilities, and
      // hence the solve phase
      computeDualInfeasibilitiesWithFixedVariableFlips();
      dualInfeasCount = info.num_dual_infeasibilities;
      solve_phase = dualInfeasCount > 0 ? kSolvePhase1 : kSolvePhase2;
      if (info.backtracking_) {
        // Backtracking, so set the bounds and primal values
        ekk_instance_.initialiseBound(SimplexAlgorithm::kDual, solve_phase);
        ekk_instance_.initialiseNonbasicValueAndMove();
        // Can now forget that we might have been backtracking
        info.backtracking_ = false;
      }
    }
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    if (solve_phase == kSolvePhase1) {
      // Phase 1
      analysis->simplexTimerStart(SimplexDualPhase1Clock);
      solvePhase1();
      analysis->simplexTimerStop(SimplexDualPhase1Clock);
      info.dual_phase1_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else if (solve_phase == kSolvePhase2) {
      // Phase 2
      analysis->simplexTimerStart(SimplexDualPhase2Clock);
      solvePhase2();
      analysis->simplexTimerStop(SimplexDualPhase2Clock);
      info.dual_phase2_iteration_count +=
          (ekk_instance_.iteration_count_ - it0);
    } else {
      // Should only be kSolvePhase1 or kSolvePhase2
      model_status = HighsModelStatus::kSolveError;
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    // Return if bailing out from solve
    if (ekk_instance_.solve_bailout_)
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    // Can have all possible cases of solve_phase
    assert(solve_phase >= kSolvePhaseMin && solve_phase <= kSolvePhaseMax);
    // Look for scenarios when the major solving loop ends
    if (solve_phase == kSolvePhaseTabooBasis) {
      // Only basis change is taboo
      ekk_instance_.model_status_ = HighsModelStatus::kUnknown;
      return ekk_instance_.returnFromSolve(HighsStatus::kWarning);
    }
    if (solve_phase == kSolvePhaseError) {
      // Solver error so return HighsStatus::kError
      assert(model_status == HighsModelStatus::kSolveError);
      return ekk_instance_.returnFromSolve(HighsStatus::kError);
    }
    if (solve_phase == kSolvePhaseExit) {
      // LP identified as not having an optimal solution
      assert(model_status == HighsModelStatus::kUnboundedOrInfeasible ||
             model_status == HighsModelStatus::kInfeasible);
      break;
    }
    if (solve_phase == kSolvePhaseOptimalCleanup ||
        solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
      // Dual infeasibilities after phase 2 which ends either
      //
      // primal feasible with dual infeasibilities, so use primal
      // simplex to clean up expecting to identify optimality
      //
      // primal infeasible with dual infeasibilities so use primal
      // simplex to clean up expecting to identify (primal)
      // infeasibility
      break;
    }
    // If solve_phase == kSolvePhaseOptimal == 0 then major solving
    // loop ends naturally since solve_phase is false
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  // Should only have these cases
  assert(solve_phase == kSolvePhaseExit || solve_phase == kSolvePhaseUnknown ||
         solve_phase == kSolvePhaseOptimal ||
         solve_phase == kSolvePhaseOptimalCleanup ||
         solve_phase == kSolvePhasePrimalInfeasibleCleanup);
  // Can't be solve_phase == kSolvePhase1 since this requires simplex
  // solver to have continued after identifying dual infeasibility.
  if (solve_phase == kSolvePhaseOptimalCleanup ||
      solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
    ekk_instance_.dual_simplex_cleanup_level_++;
    if (solve_phase == kSolvePhasePrimalInfeasibleCleanup) {
      // Primal and dual infeasibilities aren't known when cleaning up
      // after suspected unboundedness in dual phase 2. All that's
      // known is that cost shifting was required to get dual
      // feasibility after removing cost perturbations, and dual
      // simplex iterations may also have been done. This is unlike
      // clean-up of dual infeasibilities after suspected optimality,
      // when no shifting and dual simplex iterations are done after
      // removing cost perturbations.
      //
      // Determine the primal and dual infeasibilities
      ekk_instance_.computeSimplexInfeasible();
    }
    if (ekk_instance_.dual_simplex_cleanup_level_ >
        options.max_dual_simplex_cleanup_level) {
      // No clean up. Dual simplex was optimal or unbounded with
      // unperturbed costs, so say that the scaled LP has been solved
      // optimally. Optimality or infeasibility for the unscaled LP
      // are unlikely but will still be assessed honestly, so leave it
      // to the user to decide whether the solution can be accepted.
      highsLogDev(options.log_options, HighsLogType::kWarning,
                  "HEkkDual:: Cannot use level %" HIGHSINT_FORMAT
                  " primal simplex cleanup for %" HIGHSINT_FORMAT
                  " dual infeasibilities\n",
                  ekk_instance_.dual_simplex_cleanup_level_,
                  info.num_dual_infeasibilities);
      if (solve_phase == kSolvePhaseOptimalCleanup) {
        ekk_instance_.model_status_ = HighsModelStatus::kOptimal;
      } else {
        ekk_instance_.model_status_ = HighsModelStatus::kInfeasible;
      }
    } else {
      // Use primal simplex to clean up. This usually yields
      // optimality or infeasibility (according to whether solve_phase
      // is kSolvePhaseOptimalCleanup or
      // kSolvePhasePrimalInfeasibleCleanup) but can yield
      // unboundedness. Time/iteration limit return is, of course,
      // possible, as are solver error
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "HEkkDual:: Using primal simplex to try to clean up num / "
                  "max / sum = %" HIGHSINT_FORMAT
                  " / %g / %g dual infeasibilities\n",
                  info.num_dual_infeasibilities, info.max_dual_infeasibility,
                  info.sum_dual_infeasibilities);
      HighsStatus return_status = HighsStatus::kOk;
      analysis->simplexTimerStart(SimplexPrimalPhase2Clock);
      // Switch off any bound perturbation
      double save_primal_simplex_bound_perturbation_multiplier =
          info.primal_simplex_bound_perturbation_multiplier;
      info.primal_simplex_bound_perturbation_multiplier = 0;
      HEkkPrimal primal_solver(ekk_instance_);
      HighsStatus call_status = primal_solver.solve(true);
      // Restore any bound perturbation
      info.primal_simplex_bound_perturbation_multiplier =
          save_primal_simplex_bound_perturbation_multiplier;
      analysis->simplexTimerStop(SimplexPrimalPhase2Clock);
      assert(ekk_instance_.called_return_from_solve_);
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "HEkkPrimal::solve");
      // Reset called_return_from_solve_ to be false, since it's
      // called for this solve
      ekk_instance_.called_return_from_solve_ = false;
      if (return_status != HighsStatus::kOk)
        return ekk_instance_.returnFromSolve(return_status);
      if (ekk_instance_.model_status_ == HighsModelStatus::kOptimal &&
          info.num_primal_infeasibilities + info.num_dual_infeasibilities)
        highsLogDev(options.log_options, HighsLogType::kWarning,
                    "HEkkDual:: Primal simplex clean up yields optimality, "
                    "but with %" HIGHSINT_FORMAT
                    " (max %g) primal infeasibilities and " HIGHSINT_FORMAT
                    " (max %g) dual infeasibilities\n",
                    info.num_primal_infeasibilities,
                    info.max_primal_infeasibility,
                    info.num_dual_infeasibilities, info.max_dual_infeasibility);
    }
  }
  assert(model_status == HighsModelStatus::kOptimal ||
         model_status == HighsModelStatus::kInfeasible ||
         model_status == HighsModelStatus::kUnbounded ||
         model_status == HighsModelStatus::kUnboundedOrInfeasible);
  if (ekk_instance_.debugOkForSolve(SimplexAlgorithm::kDual, solve_phase) ==
      HighsDebugStatus::kLogicalError)
    return ekk_instance_.returnFromSolve(HighsStatus::kError);
  return ekk_instance_.returnFromSolve(HighsStatus::kOk);
}